

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfprintf.c
# Opt level: O1

int vfprintf(FILE *__s,char *__format,__gnuc_va_list __arg)

{
  char **mtx;
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  _PDCLIB_status_t local_80;
  
  local_80.base = 0;
  local_80.flags = 0;
  local_80.n = 0xffffffffffffffff;
  local_80.i = 0;
  local_80.current = 0;
  local_80.s = (char *)0x0;
  local_80.width = 0;
  local_80.prec = -1;
  mtx = &__s->_IO_save_base;
  local_80.stream = (_PDCLIB_file_t *)__s;
  mtx_lock((mtx_t *)mtx);
  iVar3 = _PDCLIB_prepwrite((_PDCLIB_file_t *)__s);
  if (iVar3 == -1) {
    mtx_unlock((mtx_t *)mtx);
  }
  else {
    local_80.arg[0].reg_save_area = *(void **)((long)__arg + 0x10);
    local_80.arg[0]._0_8_ = *__arg;
    local_80.arg[0].overflow_arg_area = *(void **)((long)__arg + 8);
    do {
      if (*__format == '%') {
        pcVar4 = _PDCLIB_print(__format,&local_80);
        if (pcVar4 == __format) goto LAB_00103699;
        bVar2 = true;
      }
      else {
        if (*__format == '\0') {
          mtx_unlock((mtx_t *)mtx);
          return (int)local_80.i;
        }
LAB_00103699:
        cVar1 = *__format;
        pcVar4 = __s->_IO_read_base;
        __s->_IO_read_base = pcVar4 + 1;
        __s->_IO_read_ptr[(long)pcVar4] = cVar1;
        if (__s->_IO_read_base == __s->_IO_read_end) {
LAB_001036b9:
          iVar3 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__s);
          if (iVar3 != 0) {
            mtx_unlock((mtx_t *)mtx);
            bVar2 = false;
            pcVar4 = __format;
            goto LAB_001036f2;
          }
        }
        else {
          pcVar4 = __s->_IO_buf_end;
          if (((ulong)pcVar4 & 0x200000000) == 0) {
            if (((ulong)pcVar4 & 0x400000000) != 0) goto LAB_001036b9;
          }
          else if ((((ulong)pcVar4 & 0x400000000) != 0) || (*__format == '\n')) goto LAB_001036b9;
        }
        pcVar4 = __format + 1;
        local_80.i = local_80.i + 1;
        bVar2 = true;
      }
LAB_001036f2:
      __format = pcVar4;
    } while (bVar2);
  }
  return -1;
}

Assistant:

int vfprintf( struct _PDCLIB_file_t * _PDCLIB_restrict stream, const char * _PDCLIB_restrict format, va_list arg )
{
    /* TODO: This function should interpret format as multibyte characters.  */
    struct _PDCLIB_status_t status;
    status.base = 0;
    status.flags = 0;
    status.n = SIZE_MAX;
    status.i = 0;
    status.current = 0;
    status.s = NULL;
    status.width = 0;
    status.prec = EOF;
    status.stream = stream;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepwrite( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    va_copy( status.arg, arg );

    while ( *format != '\0' )
    {
        const char * rc;

        if ( ( *format != '%' ) || ( ( rc = _PDCLIB_print( format, &status ) ) == format ) )
        {
            /* No conversion specifier, print verbatim */
            stream->buffer[ stream->bufidx++ ] = *format;

            if ( ( stream->bufidx == stream->bufsize )
                 || ( ( stream->status & _IOLBF ) && ( *format == '\n' ) )
                 || ( stream->status & _IONBF )
               )
            {
                if ( _PDCLIB_flushbuffer( stream ) != 0 )
                {
                    _PDCLIB_UNLOCK( stream->mtx );
                    return EOF;
                }
            }

            ++format;
            status.i++;
        }
        else
        {
            /* Continue parsing after conversion specifier */
            format = rc;
        }
    }

    va_end( status.arg );
    _PDCLIB_UNLOCK( stream->mtx );
    return status.i;
}